

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

bool Js::DateImplementation::UtcTimeFromStrCore
               (char16 *psz,uint ulength,double *retVal,ScriptContext *scriptContext)

{
  size_t sizeInBytes;
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  TempArenaAllocatorObject *tempAllocator;
  char16_t *pcVar7;
  CharClassifier *this;
  char16_t cVar8;
  long lVar9;
  ulong length;
  uint uVar10;
  ScriptContext *pSVar11;
  char16_t *pcVar12;
  char16_t *pcVar13;
  undefined *puVar14;
  ulong uStack_e0;
  ulong local_c8;
  int local_b4;
  int local_80;
  char16_t *local_50;
  char16 *pch;
  ulong local_40;
  uint local_34;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x3e1,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (0x7ffffffe < ulength) goto LAB_00a18b35;
  if (psz != (char16 *)0x0) {
    length = (ulong)ulength;
    bVar2 = TryParseIsoString(psz,length,retVal,scriptContext);
    if (!bVar2) {
      local_34 = ulength;
      tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"UtcTimeFromStr");
      local_40 = 0;
      pcVar7 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                         ((Memory *)&tempAllocator->allocator,
                          (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,length + 1);
      sizeInBytes = length * 2 + 2;
      pch = (char16 *)scriptContext;
      js_memcpy_s(pcVar7,sizeInBytes,psz,sizeInBytes);
      _wcslwr_unsafe(pcVar7,length + 1);
      this = ScriptContext::GetCharClassifier((ScriptContext *)pch);
      local_50 = pcVar7;
      __tls_get_addr(&PTR_013e5f18);
      local_80 = 0;
      local_b4 = 0;
switchD_00a18346_caseD_2:
switchD_00a17f52_caseD_2c:
      do {
        cVar3 = CharClassifier::SkipBiDirectionalChars(this,&local_50);
        pcVar7 = local_50;
        pSVar11 = (ScriptContext *)pch;
        if (cVar3 == L'\0') goto LAB_00a18b18;
        pcVar13 = local_50 + 1;
        local_50 = pcVar13;
      } while ((ushort)cVar3 < 0x21);
      switch(cVar3) {
      case L'(':
        iVar4 = 1;
        do {
          while( true ) {
            cVar8 = *local_50;
            if (cVar8 == L'\0') goto switchD_00a17f52_caseD_2c;
            local_50 = local_50 + 1;
            if (cVar8 == L')') break;
            if (cVar8 == L'(') {
              iVar4 = iVar4 + 1;
            }
          }
          iVar4 = iVar4 + -1;
        } while (0 < iVar4);
        goto switchD_00a17f52_caseD_2c;
      case L')':
      case L'*':
      case L'.':
        goto switchD_00a17f52_caseD_29;
      case L'+':
      case L'-':
        local_40 = (ulong)(cVar3 == L'+' ^ 5);
      case L',':
      case L'/':
        goto switchD_00a17f52_caseD_2c;
      default:
        if ((ushort)cVar3 != 0x3a) goto switchD_00a17f52_caseD_29;
        goto switchD_00a17f52_caseD_2c;
      }
    }
    goto LAB_00a18b35;
  }
  goto LAB_00a18b2f;
switchD_00a17f52_caseD_29:
  if (0x7f < (ushort)cVar3) goto LAB_00a18b18;
  iVar4 = isalpha((uint)(ushort)cVar3);
  if (iVar4 == 0) {
    uVar10 = (ushort)cVar3 - 0x30;
    pSVar11 = (ScriptContext *)pch;
    if (uVar10 < 10) {
      lVar9 = 2;
      do {
        cVar8 = *pcVar13;
        if ((((uint)local_40 & 0xfffffffe) != 4) || (cVar8 != L':')) {
          if ((0x7f < (ushort)cVar8) || (9 < (ushort)cVar8 - 0x30)) goto LAB_00a1823a;
          if (0xc < lVar9) break;
          uVar10 = (uVar10 * 10 + (uint)(ushort)cVar8) - 0x30;
        }
        pcVar13 = pcVar13 + 1;
        lVar9 = lVar9 + 2;
        local_50 = pcVar13;
      } while( true );
    }
    goto LAB_00a18b18;
  }
  local_c8 = 2;
  lVar9 = 0;
  while( true ) {
    cVar8 = *pcVar13;
    if ((0x7f < (ushort)cVar8) ||
       ((iVar4 = isalpha((uint)(ushort)cVar8), cVar8 != L'.' && (iVar4 == 0)))) break;
    pcVar13 = pcVar13 + 1;
    lVar9 = lVar9 + 0x100000000;
    local_c8 = local_c8 + 2;
    local_50 = pcVar13;
  }
  iVar4 = (int)(local_c8 >> 1) - (uint)(pcVar7[lVar9 >> 0x20] == L'.');
  while ((cVar8 != L'\0' &&
         ((pcVar12 = pcVar13, (ushort)cVar8 < 0x21 ||
          (bVar2 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)cVar8), pcVar12 = local_50
          , bVar2))))) {
    pcVar13 = pcVar12 + 1;
    cVar8 = pcVar12[1];
    local_50 = pcVar13;
  }
  pSVar11 = (ScriptContext *)pch;
  if (iVar4 == 1) goto LAB_00a18b18;
  puVar14 = &ES5Array::vtable;
  while( true ) {
    if (puVar14 < (undefined *)0x1391131) goto LAB_00a18b18;
    if ((iVar4 <= *(short *)(puVar14 + -8)) &&
       (iVar5 = bcmp(pcVar7,*(void **)(puVar14 + -0x10),(long)iVar4 * 2), iVar5 == 0)) break;
    puVar14 = puVar14 + -0x10;
  }
  pSVar11 = (ScriptContext *)pch;
  switch(*(undefined2 *)(puVar14 + -6)) {
  case 0:
    if (local_80 != 0) goto LAB_00a18b18;
    local_80 = *(int *)(puVar14 + -4);
    break;
  case 1:
    goto switchD_00a18346_caseD_1;
  case 3:
    goto LAB_00a18b18;
  case 4:
    if (local_b4 != 0) goto LAB_00a18b18;
    local_b4 = *(int *)(puVar14 + -4);
  }
  goto switchD_00a18346_caseD_2;
LAB_00a1823a:
  while ((cVar8 != L'\0' &&
         ((pcVar7 = pcVar13, (ushort)cVar8 < 0x21 ||
          (bVar2 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)cVar8), pcVar7 = local_50,
          bVar2))))) {
    pcVar13 = pcVar7 + 1;
    cVar8 = pcVar7[1];
    local_50 = pcVar13;
  }
  pSVar11 = (ScriptContext *)pch;
  switch((int)local_40) {
  case 1:
    if (0x3b < (int)uVar10) goto LAB_00a18b18;
    local_40 = 0;
    if (cVar8 != L':') goto switchD_00a18346_caseD_2;
    uStack_e0 = 2;
    break;
  case 2:
    if (0x3b < (int)uVar10) goto LAB_00a18b18;
    local_40 = 0;
    if (cVar8 != L'.') goto switchD_00a18346_caseD_2;
    uStack_e0 = 3;
    break;
  case 3:
    if (((ulong)(lVar9 >> 1) < 2) || (lVar9 == 4)) {
      local_40 = 0;
    }
    else {
      local_40 = 0;
      if (3 < (ulong)(lVar9 >> 1)) {
        local_40 = 0;
      }
    }
    goto switchD_00a18346_caseD_2;
  case 4:
  case 5:
    goto LAB_00a18b18;
  case 6:
    goto LAB_00a18b18;
  case 7:
    goto LAB_00a18b18;
  case 8:
    goto LAB_00a18b18;
  default:
    goto LAB_00a18b18;
  }
  local_50 = local_50 + 1;
  local_40 = uStack_e0;
  goto switchD_00a18346_caseD_2;
switchD_00a18346_caseD_1:
LAB_00a18b18:
  ulength = local_34;
  ScriptContext::ReleaseTemporaryAllocator(pSVar11,tempAllocator);
LAB_00a18b2f:
  *retVal = NAN;
LAB_00a18b35:
  return ulength < 0x7fffffff;
}

Assistant:

bool DateImplementation::UtcTimeFromStrCore(
        __in_ecount_z(ulength) const char16 *psz,
        unsigned int ulength,
        double &retVal,
        ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        if (ulength >= 0x7fffffff)
        {
            //Prevent unreasonable requests from causing overflows.
            return false;
        }

        if (nullptr == psz)
        {
            retVal = JavascriptNumber::NaN;
            return true;
        }

        // Try to parse the string as the ISO format first
        if(TryParseIsoString(psz, ulength, retVal, scriptContext))
        {
            return true;
        }

        enum
        {
            ssNil,
            ssMinutes,
            ssSeconds,
            ssMillisecond,
            ssAddOffset,
            ssSubOffset,
            ssDate,
            ssMonth,
            ssYear
        };

        char16 *pchBase;
        char16 *pch;
        char16 ch;
        char16 *pszSrc = nullptr;

        const int32 lwNil = 0x80000000;
        int32 cch;
        int32 depth;
        int32 lwT;
        int32 lwYear = lwNil;
        int32 lwMonth = lwNil;
        int32 lwDate = lwNil;
        int32 lwTime = lwNil;
        int32 lwMillisecond = lwNil;
        int32 lwZone = lwNil;
        int32 lwOffset = lwNil;

        int32 ss = ssNil;
        const SZS *pszs;

        bool fUtc;

        int tAmPm = 0;
        int tBcAd = 0;

        size_t numOfDigits = 0;
        double tv = JavascriptNumber::NaN; // Initialized for error handling.

        //Create a copy to analyze
        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("UtcTimeFromStr"));

        pszSrc = AnewArray(tempAllocator, char16, ulength + 1);

        size_t size = sizeof(char16) * (ulength + 1);
        js_memcpy_s(pszSrc, size, psz, size);

        _wcslwr_s(pszSrc,ulength+1);
        bool isDateNegativeVersion5 = false;
        bool isNextFieldDateNegativeVersion5 = false;
        bool isZeroPaddedYear = false;
        const Js::CharClassifier *classifier = scriptContext->GetCharClassifier();
        #pragma prefast(suppress: __WARNING_INCORRECT_VALIDATION, "pch is guaranteed to be null terminated by __in_z on psz and js_memcpy_s copying the null byte")
        for (pch = pszSrc; 0 != (ch = classifier->SkipBiDirectionalChars(pch));)
        {
            pch++;
            if (ch <= ' ')
            {
                continue;
            }

            switch (ch)
            {
                case '(':
                {
                    // skip stuff in parens
                    for (depth = 1; 0 != (ch = *pch); )
                    {
                        pch++;
                        if (ch == '(')
                        {
                            depth++;
                        }
                        else if (ch == ')' && --depth <= 0)
                        {
                            break;
                        }
                    }
                    continue;
                }
                case ',':
                case ':':
                case '/':
                {
                    // ignore these
                    continue;
                }
                case '+':
                case '-':
                {
                    if (lwNil == lwTime)
                    {
                        goto LError;
                    }
                    ss = (ch == '+') ? ssAddOffset : ssSubOffset;
                    continue;
                }
            }


            pchBase = pch - 1;
            if (!FBig(ch) && isalpha(ch))
            {
                for ( ; !FBig(*pch) && (isalpha(*pch) || '.' == *pch); pch++)
                    ;

                cch = (int32)(pch - pchBase);

                if ('.' == pchBase[cch - 1])
                {
                    cch--;
                }
                //Assert(cch > 0);

                // skip to the next real character
                while (0 != (*pch) && (*pch <= ' ' || classifier->IsBiDirectionalChar(*pch)))
                {
                    pch++;
                }

                // have an alphabetic token - look it up
                if (cch == 1)
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    // military version of time zone
                    // z = GMT
                    // j isn't used
                    // a to m are 1 to 12
                    // n to y are -1 to -12
                    if (lwNil != lwZone)
                    {
                        goto LError;
                    }
                    if (ch <= 'm')
                    {
                        if (ch == 'j' || ch < 'a')
                        {
                            goto LError;
                        }
                        lwZone = (int32)(ch - 'a' + (ch < 'j')) * 60;
                    }
                    else if (ch <= 'y')
                    {
                        lwZone = -(int32)(ch - 'm') * 60;
                    }
                    else if (ch == 'z')
                    {
                        lwZone = 0;
                    }
                    else
                    {
                        goto LError;
                    }

                    // look for a time zone offset
                    ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                        ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                    continue;
                }

                // look for a token
                for (pszs = g_rgszs + kcszs; ; )
                {
                    if (pszs-- <= g_rgszs)
                        goto LError;
                    if (cch <= pszs->cch &&
                        0 == memcmp(pchBase, pszs->psz, cch * sizeof(char16)))
                    {
                        break;
                    }
                }

                switch (pszs->szst)
                {
                    case ParseStringTokenType::BcAd:
                    {
                        if (tBcAd != 0)
                        {
                            goto LError;
                        }
                        tBcAd = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::AmPm:
                    {
                        if (tAmPm != 0)
                        {
                            goto LError;
                        }
                        tAmPm = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::Month:
                    {
                        if (lwNil != lwMonth)
                        {
                            goto LError;
                        }
                        lwMonth = pszs->lwVal;
                        if ('-' == *pch)
                        {
                            // handle the case date is negative for "Thu, 23 Sep -0007 00:00:00 GMT"
                            isDateNegativeVersion5 = true;
                            pch++;
                        }
                        break;
                    }
                    case ParseStringTokenType::Zone:
                    {
                        if (lwNil != lwZone)
                        {
                            goto LError;
                        }
                        lwZone = pszs->lwVal;

                        // look for a time zone offset
                        ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                            ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                        break;
                    }
                }
                continue;
            }

            if (FBig(ch) || !isdigit(ch))
            {
                goto LError;
            }

            for (lwT = ch - '0'; ; pch++)
            {
                // for time zone offset HH:mm, we already got HH so skip ':' and grab mm
                if (((ss == ssAddOffset) || (ss == ssSubOffset)) && (*pch == ':')) 
                {
                    continue;
                }
                if (FBig(*pch) || !isdigit(*pch))
                {
                    break;
                }
                // to avoid overflow
                if (pch - pchBase > 6)
                {
                    goto LError;
                }
                // convert string to number, e.g. 07:30 -> 730
                lwT = lwT * 10 + *pch - '0';
            }

            numOfDigits = pch - pchBase;
            // skip to the next real character
            while (0 != (ch = *pch) && (ch <= ' ' || classifier->IsBiDirectionalChar(ch)))
            {
                pch++;
            }

            switch (ss)
            {
                case ssAddOffset:
                case ssSubOffset:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwOffset || lwNil == lwTime)
                        goto LError;
                    // convert into minutes, e.g. 730 -> 7*60+30
                    lwOffset = lwT < 24 ? lwT * 60 :
                        (lwT % 100) + (lwT / 100) * 60;
                    if (ssSubOffset == ss)
                        lwOffset = -lwOffset;
                    lwZone = 0; // An offset is always with respect to UTC
                    ss = ssNil;
                    break;
                }
                case ssMinutes:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT * 60;
                    ss = (ch == ':') ? (pch++, ssSeconds) : ssNil;
                    break;
                }
                case ssSeconds:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT;
                    ss = (ch == '.') ? (pch++, ssMillisecond) : ssNil;
                    break;
                }
                case ssMillisecond:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (numOfDigits <= 1)
                    {
                        // 1 digit only, treat it as hundreds
                        lwMillisecond = lwT * 100;
                    }
                    else if (numOfDigits <= 2)
                    {
                        // 2 digit only, treat it as tens
                        lwMillisecond = lwT * 10;
                    }
                    else if (numOfDigits <= 3)
                    {
                        // canonical 3 digit, per EcmaScript spec
                        lwMillisecond = lwT;
                    }
                    else
                    {
                        // ignore any digits beyond the third
                        lwMillisecond = (pchBase[0] - '0') * 100 + (pchBase[1] - '0') * 10 + (pchBase[2] - '0');
                    }

                    ss = ssNil;
                    break;
                }
                case ssDate:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwDate)
                        goto LError;
                    lwDate = lwT;

                    if ((lwNil == lwYear) && FDateDelimiter(ch))
                    {
                        // We have already parsed the year if the date is specified as YYYY/MM/DD,
                        // but not when it is specified as MM/DD/YYYY.
                        ss = ssYear;
                        pch++;
                    }
                    else
                    {
                        ss = ssNil;
                    }
                    break;
                }
                case ssMonth:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwMonth)
                    {
                        goto LError;
                    }

                    lwMonth = lwT - 1;

                    if (FDateDelimiter(ch))
                    {
                        // Mark the next token as the date so that it won't be confused with another token.
                        // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                        // the time offset without this.
                        ss = ssDate;
                        pch++;
                    }

                    break;
                }
                case ssYear:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwYear)
                        goto LError;

                    AssertMsg(isDateNegativeVersion5 == false, "lwYear should be positive as pre-version:5 parsing");
                    lwYear = lwT;
                    ss = ssNil;
                    if (lwT < 1000 && numOfDigits >= 4)
                    {
                        isZeroPaddedYear = true;
                    }
                    break;
                }
                default:
                {
                    // assumptions for getting a YEAR:
                    //    - an absolute value greater or equal than 70 (thus not hour!)
                    //    - wasn't preceded by negative sign for -version:5 year format
                    //    - lwT has at least 4 digits (e.g. 0017 is year 17 AD)
                    if (lwT >= 70 || isNextFieldDateNegativeVersion5 || numOfDigits >= 4)
                    {
                        // assume it's a year - this is used particularly as version:5 year parsing
                        if (lwNil != lwYear)
                            goto LError;

                        // handle the case date is negative for "Tue Feb 02 -2012 01:02:03 GMT-0800"
                        lwYear = isDateNegativeVersion5 ? -lwT : lwT;
                        isNextFieldDateNegativeVersion5 = false;

                        if (lwT < 1000 && numOfDigits >= 4)
                        {
                            isZeroPaddedYear = true;
                        }

                        if (FDateDelimiter(ch))
                        {
                            // Mark the next token as the month so that it won't be confused with another token.
                            // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                            // the time offset without this.
                            ss = ssMonth;
                            pch++;
                        }

                        break;
                    }

                    switch (ch)
                    {
                        case ':':
                        {
                            // hour
                            if (lwNil != lwTime)
                                goto LError;
                            if (lwT >= 24)
                                goto LError;
                            lwTime = lwT * 3600;
                            ss = ssMinutes;
                            pch++;
                            break;
                        }
                        case '/':
                        case '-':
                        {
                            // month
                            if (lwNil != lwMonth)
                            {
                                // can be year
                                if (lwNil != lwYear)
                                {
                                    // both were already parsed!
                                    goto LError;
                                }
                                else
                                {
                                    // this is a day - with the negative sign for the date (version 5+)
                                    lwDate = lwT;
                                    isDateNegativeVersion5 = true;

                                    // mark the next field to be year (version 5+)
                                    isNextFieldDateNegativeVersion5 = true;
                                }
                            }
                            else
                            {
                                // this is a month
                                lwMonth = lwT - 1;
                                ss = ssDate;
                            }
                            pch++;
                            break;
                        }
                        default:
                        {
                            // date
                            if (lwNil != lwDate)
                                goto LError;
                            lwDate = lwT;
                            break;
                        }
                    }
                    break;
                }
            }
            continue;
        }

        if (lwNil == lwYear ||
            lwNil == lwMonth || lwMonth > 11 ||
            lwNil == lwDate || lwDate > 31)
        {
            goto LError;
        }

        if (tBcAd != 0)
        {
            if (tBcAd < 0)
            {
                // BC. Note that 1 BC is year 0 and 2 BC is year -1.
                lwYear = -lwYear + 1;
            }
        }
        else if (lwYear < 50 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 2000;
        }
        else if (lwYear < 100 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 1900;
        }


        if (tAmPm != 0)
        {
            if (lwNil == lwTime)
            {
                goto LError;
            }
            if (lwTime >= 12 * 3600L && lwTime < 13 * 3600L)
            {
                // In the 12:00 hour. AM means subtract 12 hours and PM means
                // do nothing.
                if (tAmPm < 0)
                {
                    lwTime -= 12 * 3600L;
                }
            }
            else
            {
                // Not in the 12:00 hour. AM means do nothing and PM means
                // add 12 hours.
                if (tAmPm > 0)
                {
                    if (lwTime >= 12 * 3600L)
                    {
                        goto LError;
                    }
                    lwTime += 12 * 3600L;
                }
            }
        }
        else if (lwNil == lwTime)
        {
            lwTime = 0;
        }

        if (lwNil == lwMillisecond)
        {
            lwMillisecond = 0;
        }

        if (lwNil != lwZone)
        {
            lwTime -= lwZone * 60;
            fUtc = TRUE;
        }
        else
        {
            fUtc = FALSE;
        }
        if (lwNil != lwOffset)
        {
            lwTime -= lwOffset * 60;
        }

        // Rebuild time.
        tv = TvFromDate(lwYear, lwMonth, lwDate - 1, (double)lwTime * 1000 + lwMillisecond);
        if (!fUtc)
        {
            tv = GetTvUtc(tv, scriptContext);
        }

LError:
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        retVal = tv;
        return true;
    }